

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

int acmod_set_insenfh(acmod_t *acmod,FILE *senfh)

{
  char *__s1;
  int32 iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  float64 fVar5;
  char **val;
  uint8 local_44 [4];
  char **name;
  double local_38;
  
  acmod->insenfh = senfh;
  if (senfh == (FILE *)0x0) {
    acmod->n_feat_frame = 0;
    iVar2 = ps_config_bool(acmod->config,"compallsen");
    acmod->compallsen = (uint8)iVar2;
  }
  else {
    acmod->compallsen = '\x01';
    iVar1 = bio_readhdr(senfh,&name,&val,(int32 *)local_44);
    if (iVar1 < 0) {
LAB_0011a62a:
      bio_hdrarg_free(name,val);
      return -1;
    }
    for (lVar4 = 0; __s1 = *(char **)((long)name + lVar4), __s1 != (char *)0x0; lVar4 = lVar4 + 8) {
      iVar2 = strcmp(__s1,"n_sen");
      if ((iVar2 == 0) && (uVar3 = atoi(*(char **)((long)val + lVar4)), uVar3 != acmod->mdef->n_sen)
         ) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                ,0x32a,"Number of senones in senone file (%d) does not match mdef (%d)\n",
                (ulong)uVar3);
        goto LAB_0011a62a;
      }
      iVar2 = strcmp(__s1,"logbase");
      if (iVar2 == 0) {
        local_38 = atof_c(*(char **)((long)val + lVar4));
        fVar5 = logmath_get_base(acmod->lmath);
        if (0.001 < ABS(local_38 - (double)fVar5)) {
          local_38 = atof_c(*(char **)((long)val + lVar4));
          fVar5 = logmath_get_base(acmod->lmath);
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                  ,0x333,"Logbase in senone file (%f) does not match acmod (%f)\n",local_38,fVar5);
          goto LAB_0011a62a;
        }
      }
    }
    acmod->insen_swap = local_44[0];
    bio_hdrarg_free(name,val);
  }
  return 0;
}

Assistant:

int
acmod_set_insenfh(acmod_t *acmod, FILE *senfh)
{
    acmod->insenfh = senfh;
    if (senfh == NULL) {
        acmod->n_feat_frame = 0;
        acmod->compallsen = ps_config_bool(acmod->config, "compallsen");
        return 0;
    }
    acmod->compallsen = TRUE;
    return acmod_read_senfh_header(acmod);
}